

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O1

void __thiscall RealTrafficConnection::SendXPSimTime(RealTrafficConnection *this)

{
  int iVar1;
  long lVar2;
  char s [50];
  char acStack_58 [64];
  
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar2 = lVar2 / 1000000;
  if (dataRefs.rtSTC == STC_SIM_TIME_PLUS_BUFFER) {
    iVar1 = XPLMGetDatai(dataRefs.adrXP[3]);
    if (iVar1 == 0) {
      lVar2 = (long)dataRefs.fdBufPeriod * 1000 + dataRefs.lastXPSimTime_ms;
    }
  }
  else if (dataRefs.rtSTC == STC_SIM_TIME_MANUALLY) {
    lVar2 = lVar2 + (long)dataRefs.rtManTOfs * -60000;
  }
  snprintf(acStack_58,0x32,"Qs123=%lld\n",lVar2);
  SendMsg(this,acStack_58);
  return;
}

Assistant:

void RealTrafficConnection::SendXPSimTime()
{
    // Which time stamp to send?
    long long ts = (long long)std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();
    
    switch (dataRefs.GetRTSTC()) {
        case STC_NO_CTRL:                           // always use system time
            break;
            
        case STC_SIM_TIME_MANUALLY:                 // time offset configured manually: Just deduct from 'now'
            ts -= ((long long)dataRefs.GetRTManTOfs()) * 60000LL;
            break;
            
        case STC_SIM_TIME_PLUS_BUFFER:              // Simulated time
            if (!dataRefs.IsUsingSystemTime()) {    // not using system time:
                ts = dataRefs.GetXPSimTime_ms();    // send simulated time
                // add buffering period, so planes match up with simulator time exactly instead of being delayed
                ts += (long long)(dataRefs.GetFdBufPeriod()) * 1000LL;
            }
    }
    
    SendTime(ts);
}